

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O1

void format_message(char *msg,unsigned_long options)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((options & 1) == 0) {
    CTcHostIfc::print_err(G_hostifc,"%s",msg);
    return;
  }
  CTcHostIfc::print_err(G_hostifc,"\n");
  if (*msg != '\0') {
    pcVar5 = (char *)0x0;
    pcVar4 = msg;
LAB_0022ef62:
    do {
      pcVar6 = pcVar4;
      pcVar4 = pcVar6;
      if (*pcVar6 != '\0') {
        if (*pcVar6 == ' ') {
          pcVar5 = pcVar6;
        }
        if (((long)pcVar6 - (long)msg < 0x4f) || (pcVar4 = pcVar5, pcVar5 == (char *)0x0)) {
          pcVar4 = pcVar6 + 1;
          goto LAB_0022ef62;
        }
      }
      lVar2 = (long)pcVar4 - (long)msg;
      pcVar5 = pcVar4;
      do {
        lVar3 = lVar2;
        pcVar5 = pcVar5 + -1;
        if (pcVar4 <= msg) break;
        pcVar1 = pcVar4 + -1;
        pcVar4 = pcVar4 + -1;
        lVar2 = lVar3 + -1;
      } while (*pcVar1 == ' ');
      CTcHostIfc::print_err(G_hostifc,"%.*s\n",lVar3);
      do {
        pcVar4 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar4 == ' ');
      msg = pcVar5;
      pcVar4 = pcVar5;
    } while ((*pcVar6 != '\0') ||
            (pcVar5 = (char *)0x0, msg = pcVar6, pcVar4 = pcVar6, *pcVar6 != '\0'));
  }
  return;
}

Assistant:

static void format_message(const char *msg, unsigned long options)
{
    /*
     *   if we're in verbose mode, word-wrap to 80 columns; otherwise just
     *   print it as-is 
     */
    if ((options & TCMAIN_ERR_VERBOSE) != 0)
    {
        const char *p;
        const int line_wid = 79;

        /* start on a new line, to skip any prefix text */
        G_hostifc->print_err("\n");

        /* word-wrap to 80 columns */
        for (p = msg ; *p != '\0' ; )
        {
            const char *start;
            const char *sp;

            /* find the next word break */
            for (sp = 0, start = p ; ; )
            {
                /* if this is a space, note it */
                if (*p == ' ')
                    sp = p;

                /* 
                 *   if we're at the end of the line, or we're over the line
                 *   width and we found a space, break here 
                 */
                if (*p == '\0' || (p - start >= line_wid && sp != 0))
                {
                    /* if we've reached the end, print the rest */
                    if (*p == '\0')
                        sp = p;

                    /* trim off trailing spaces */
                    for ( ; sp > start && *(sp-1) == ' ' ; --sp) ;

                    /* show this part */
                    G_hostifc->print_err("%.*s\n", sp - start, start);

                    /* skip leading spaces */
                    for ( ; *sp == ' ' ; ++sp) ;

                    /* if this is the end of the line, we're done */
                    if (*p == '\0')
                        break;

                    /* start over here */
                    start = p = sp;
                }
                else
                {
                    /* this one fits - skip it */
                    ++p;
                }
            }
        }
    }
    else
    {
        /* display it */
        G_hostifc->print_err("%s", msg);
    }
}